

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O3

int lws_client_ws_upgrade(lws *wsi,char **cce)

{
  char *pcVar1;
  char cVar2;
  ah_data_idx_t aVar3;
  lws_context *plVar4;
  lws_vhost *plVar5;
  lws_protocols *plVar6;
  lws_protocols *plVar7;
  _lws_websocket_related *p_Var8;
  lws_protocols *plVar9;
  int iVar10;
  uint uVar11;
  lws_tokenize_elem lVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  char *pcVar16;
  size_t sVar17;
  uchar *puVar18;
  char *__s1;
  lws_protocols *plVar19;
  long lVar20;
  lws_tokenize ts;
  char buf [64];
  lws_tokenize local_a0;
  char local_78 [72];
  
  if ((wsi->field_0x475 & 8) != 0) {
    _lws_log(2,"%s: client ws-over-h2 upgrade not supported yet\n","lws_client_ws_upgrade");
    iVar10 = 3;
    pcVar15 = "HS: h2 / ws upgrade unsupported";
    goto LAB_0012c25c;
  }
  aVar3 = ((wsi->http).ah)->http_response;
  if (aVar3 != 0x65) {
    if (aVar3 == 0x191) {
      _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n",0x191);
      iVar10 = 3;
      pcVar15 = "HS: ws upgrade unauthorized";
    }
    else {
      _lws_log(2,"lws_client_handshake: got bad HTTP response \'%d\'\n");
      iVar10 = 3;
      pcVar15 = "HS: ws upgrade response not 101";
    }
    goto LAB_0012c25c;
  }
  plVar4 = (wsi->a).context;
  iVar10 = lws_hdr_total_length(wsi,WSI_TOKEN_ACCEPT);
  if (iVar10 == 0) {
    _lws_log(8,"no ACCEPT\n");
    iVar10 = 3;
    pcVar15 = "HS: ACCEPT missing";
    goto LAB_0012c25c;
  }
  pcVar15 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_UPGRADE);
  if (pcVar15 == (char *)0x0) {
    _lws_log(8,"no UPGRADE\n");
    iVar10 = 3;
    pcVar15 = "HS: UPGRADE missing";
    goto LAB_0012c25c;
  }
  cVar2 = *pcVar15;
  pcVar16 = pcVar15;
  while (cVar2 != '\0') {
    iVar10 = tolower((int)cVar2);
    *pcVar16 = (char)iVar10;
    cVar2 = pcVar16[1];
    pcVar16 = pcVar16 + 1;
  }
  iVar10 = strcmp(pcVar15,"websocket");
  if (iVar10 != 0) {
    _lws_log(2,"lws_client_handshake: got bad Upgrade header \'%s\'\n",pcVar15);
    iVar10 = 3;
    pcVar15 = "HS: Upgrade to something other than websocket";
    goto LAB_0012c25c;
  }
  lws_tokenize_init(&local_a0,local_78,5);
  uVar11 = lws_hdr_copy(wsi,local_78,0x3f,WSI_TOKEN_CONNECTION);
  if ((int)uVar11 < 1) {
LAB_0012bdd0:
    _lws_log(8,"%s: malfored connection \'%s\'\n","lws_client_ws_upgrade",local_78);
    iVar10 = 3;
    pcVar15 = "HS: UPGRADE malformed";
    goto LAB_0012c25c;
  }
  local_a0.len = (size_t)uVar11;
  do {
    do {
      lVar12 = lws_tokenize(&local_a0);
    } while (lVar12 == LWS_TOKZE_DELIMITER);
    if (lVar12 != LWS_TOKZE_TOKEN) goto LAB_0012bdd0;
    iVar10 = strncasecmp(local_a0.token,"upgrade",local_a0.token_len);
  } while (iVar10 != 0);
  pcVar15 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
  if (pcVar15 == (char *)0x0) {
    _lws_log(0x20,"lws_client_int_s_hs: no protocol list\n");
  }
  else {
    _lws_log(0x20,"lws_client_int_s_hs: protocol list \'%s\'\n",pcVar15);
  }
  iVar10 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
  if (iVar10 != 0) {
    pcVar16 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_PROTOCOL);
    sVar17 = strlen(pcVar16);
    if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
      __s1 = pcVar15;
      do {
        iVar10 = strncmp(__s1,pcVar16,sVar17 & 0xffffffff);
        if ((iVar10 == 0) && ((__s1[(int)sVar17] == '\0' || (__s1[(int)sVar17] == ',')))) {
          if (pcVar15 != (char *)0x0) goto LAB_0012bf0e;
          break;
        }
        do {
          cVar2 = *__s1;
          if (cVar2 == '\0') break;
          __s1 = __s1 + 1;
        } while (cVar2 != ',');
        __s1 = __s1 + -1;
        do {
          pcVar1 = __s1 + 1;
          __s1 = __s1 + 1;
        } while (*pcVar1 == ' ');
      } while (*pcVar1 != '\0');
    }
    _lws_log(8,"%s: got bad protocol %s\n","lws_client_ws_upgrade",pcVar16);
    iVar10 = 2;
    pcVar15 = "HS: PROTOCOL malformed";
    goto LAB_0012c25c;
  }
  iVar10 = 0;
  _lws_log(8,"%s: WSI_TOKEN_PROTOCOL is null\n","lws_client_ws_upgrade");
  plVar6 = (wsi->a).protocol;
  if (plVar6 == (lws_protocols *)0x0) {
    (wsi->a).protocol = ((wsi->a).vhost)->protocols;
  }
  else {
    pcVar16 = plVar6->name;
LAB_0012bf0e:
    uVar11 = wsi->wsistate;
    if ((uVar11 >> 0x1c & 1) == 0) {
      (wsi->a).protocol = (lws_protocols *)0x0;
    }
    plVar5 = (wsi->a).vhost;
    iVar14 = plVar5->count_protocols;
    if ((long)iVar14 < 1) {
      iVar10 = 0;
LAB_0012bfba:
      if (iVar10 == iVar14) goto LAB_0012bfc3;
    }
    else {
      plVar6 = (wsi->a).protocol;
      lVar20 = 0;
      iVar10 = 0;
      do {
        if (plVar6 == (lws_protocols *)0x0) {
          plVar19 = plVar5->protocols;
          iVar13 = strcmp(pcVar16,*(char **)((long)&plVar19->name + lVar20));
          if (iVar13 == 0) {
            (wsi->a).protocol = (lws_protocols *)((long)&plVar19->name + lVar20);
            goto LAB_0012bfba;
          }
        }
        iVar10 = iVar10 + 1;
        lVar20 = lVar20 + 0x38;
      } while ((long)iVar14 * 0x38 != lVar20);
LAB_0012bfc3:
      if ((uVar11 >> 0x1c & 1) == 0) {
        _lws_log(8,"%s: fail protocol %s\n","lws_client_ws_upgrade",pcVar16);
        iVar10 = 2;
        pcVar15 = "HS: Cannot match protocol";
        goto LAB_0012c25c;
      }
      plVar6 = plVar5->protocols;
      if (plVar6->callback == (lws_callback_function *)0x0) {
        iVar10 = 0;
        lVar20 = 0;
      }
      else {
        plVar7 = (wsi->a).protocol;
        lVar20 = 0;
        plVar19 = plVar6;
        do {
          if ((plVar7 != (lws_protocols *)0x0) &&
             (iVar10 = strcmp(plVar7->name,plVar19->name), iVar10 == 0)) {
            (wsi->a).protocol = plVar19;
            break;
          }
          lVar20 = lVar20 + 1;
          plVar9 = plVar19 + 1;
          plVar19 = plVar19 + 1;
        } while (plVar9->callback != (lws_callback_function *)0x0);
        iVar10 = (int)lVar20;
      }
      if (plVar6[lVar20].callback == (lws_callback_function *)0x0) {
        plVar6 = (wsi->a).protocol;
        if (plVar6 == (lws_protocols *)0x0) {
          _lws_log(1,"No protocol on client\n");
        }
        else {
          _lws_log(1,"Failed to match protocol %s\n",plVar6->name);
        }
        iVar10 = 2;
        pcVar15 = "ws protocol no match";
        goto LAB_0012c25c;
      }
    }
    _lws_log(0x10,"Selected protocol %s\n",((wsi->a).protocol)->name);
  }
  lws_same_vh_protocol_insert(wsi,iVar10);
  pcVar15 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_ACCEPT);
  pcVar16 = ((wsi->http).ah)->initial_handshake_hash_base64;
  iVar10 = strcmp(pcVar15,pcVar16);
  if (iVar10 != 0) {
    iVar10 = 2;
    _lws_log(2,"lws_client_int_s_hs: accept \'%s\' wrong vs \'%s\'\n",pcVar15,pcVar16);
    pcVar15 = "HS: Accept hash wrong";
    goto LAB_0012c25c;
  }
  iVar10 = lws_ensure_user_space(wsi);
  if (iVar10 == 0) {
    iVar10 = 2;
    iVar14 = (*((wsi->a).protocol)->callback)
                       (wsi,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,wsi->user_space,(void *)0x0,0);
    if (iVar14 != 0) {
      pcVar15 = "HS: Rejected by filter cb";
      goto LAB_0012c25c;
    }
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
    lws_header_table_detach(wsi,0);
    lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,&role_ops_ws);
    lws_validity_confirmed(wsi);
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffffffffff9fff | 0x2000;
    uVar11 = (uint)((wsi->a).protocol)->rx_buffer_size;
    if (uVar11 == 0) {
      uVar11 = plVar4->pt_serv_buf_size;
    }
    puVar18 = (uchar *)lws_realloc((void *)0x0,(ulong)(uVar11 + 0x14),"client frame buffer");
    p_Var8 = wsi->ws;
    p_Var8->rx_ubuf = puVar18;
    if (puVar18 != (uchar *)0x0) {
      p_Var8->rx_ubuf_alloc = uVar11 + 0x10;
      _lws_log(0x10,"handshake OK for protocol %s\n",((wsi->a).protocol)->name);
      iVar10 = 3;
      iVar14 = (*((wsi->a).protocol)->callback)
                         (wsi,LWS_CALLBACK_CLIENT_ESTABLISHED,wsi->user_space,(void *)0x0,0);
      if (iVar14 == 0) {
        return 0;
      }
      pcVar15 = "HS: Rejected at CLIENT_ESTABLISHED";
      goto LAB_0012c25c;
    }
    _lws_log(1,"Out of Mem allocating rx buffer %d\n",(ulong)(uVar11 + 0x10));
  }
  else {
    _lws_log(1,"Problem allocating wsi user mem\n");
  }
  iVar10 = 2;
  pcVar15 = "HS: OOM";
LAB_0012c25c:
  *cce = pcVar15;
  return iVar10;
}

Assistant:

int
lws_client_ws_upgrade(struct lws *wsi, const char **cce)
{
	struct lws_context *context = wsi->a.context;
	struct lws_tokenize ts;
	int n, len, okay = 0;
	lws_tokenize_elem e;
	char *p, buf[64];
	const char *pc;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	char *sb = (char *)&pt->serv_buf[0];
	const struct lws_ext_options *opts;
	const struct lws_extension *ext;
	char ext_name[128];
	const char *c, *a;
	int more = 1;
	char ignore;
#endif

	if (wsi->client_mux_substream) {/* !!! client ws-over-h2 not there yet */
		lwsl_warn("%s: client ws-over-h2 upgrade not supported yet\n",
			  __func__);
		*cce = "HS: h2 / ws upgrade unsupported";
		goto bail3;
	}

	if (wsi->http.ah->http_response == 401) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade unauthorized";
		goto bail3;
	}

	if (wsi->http.ah->http_response != 101) {
		lwsl_warn(
		       "lws_client_handshake: got bad HTTP response '%d'\n",
		       wsi->http.ah->http_response);
		*cce = "HS: ws upgrade response not 101";
		goto bail3;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_ACCEPT) == 0) {
		lwsl_info("no ACCEPT\n");
		*cce = "HS: ACCEPT missing";
		goto bail3;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_UPGRADE);
	if (!p) {
		lwsl_info("no UPGRADE\n");
		*cce = "HS: UPGRADE missing";
		goto bail3;
	}
	strtolower(p);
	if (strcmp(p, "websocket")) {
		lwsl_warn(
		      "lws_client_handshake: got bad Upgrade header '%s'\n", p);
		*cce = "HS: Upgrade to something other than websocket";
		goto bail3;
	}

	/* connection: must have "upgrade" */

	lws_tokenize_init(&ts, buf, LWS_TOKENIZE_F_COMMA_SEP_LIST |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	n = lws_hdr_copy(wsi, buf, sizeof(buf) - 1, WSI_TOKEN_CONNECTION);
	if (n <= 0) /* won't fit, or absent */
		goto bad_conn_format;
	ts.len = (unsigned int)n;

	do {
		e = lws_tokenize(&ts);
		switch (e) {
		case LWS_TOKZE_TOKEN:
			if (!strncasecmp(ts.token, "upgrade", ts.token_len))
				e = LWS_TOKZE_ENDED;
			break;

		case LWS_TOKZE_DELIMITER:
			break;

		default: /* includes ENDED found by the tokenizer itself */
bad_conn_format:
			lwsl_info("%s: malfored connection '%s'\n",
				  __func__, buf);
			*cce = "HS: UPGRADE malformed";
			goto bail3;
		}
	} while (e > 0);

	pc = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
#if defined(_DEBUG)
	if (!pc) {
		lwsl_parser("lws_client_int_s_hs: no protocol list\n");
	} else
		lwsl_parser("lws_client_int_s_hs: protocol list '%s'\n", pc);
#endif

	/*
	 * confirm the protocol the server wants to talk was in the list
	 * of protocols we offered
	 */

	len = lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL);
	if (!len) {
		lwsl_info("%s: WSI_TOKEN_PROTOCOL is null\n", __func__);
		/*
		 * no protocol name to work from, if we don't already have one
		 * default to first protocol
		 */

		if (wsi->a.protocol) {
			p = (char *)wsi->a.protocol->name;
			goto identify_protocol;
		}

		/* no choice but to use the default protocol */

		n = 0;
		wsi->a.protocol = &wsi->a.vhost->protocols[0];
		goto check_extensions;
	}

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL);
	len = (int)strlen(p);

	while (pc && *pc && !okay) {
		if (!strncmp(pc, p, (unsigned int)len) &&
		    (pc[len] == ',' || pc[len] == '\0')) {
			okay = 1;
			continue;
		}
		while (*pc && *pc++ != ',')
			;
		while (*pc == ' ')
			pc++;
	}

	if (!okay) {
		lwsl_info("%s: got bad protocol %s\n", __func__, p);
		*cce = "HS: PROTOCOL malformed";
		goto bail2;
	}

identify_protocol:

#if defined(LWS_WITH_HTTP_PROXY)
	lws_strncpy(wsi->ws->actual_protocol, p,
		    sizeof(wsi->ws->actual_protocol));
#endif

	/*
	 * identify the selected protocol struct and set it
	 */
	n = 0;
	/* keep client connection pre-bound protocol */
	if (!lwsi_role_client(wsi))
		wsi->a.protocol = NULL;

	while (n < wsi->a.vhost->count_protocols) {
		if (!wsi->a.protocol &&
		    strcmp(p, wsi->a.vhost->protocols[n].name) == 0) {
			wsi->a.protocol = &wsi->a.vhost->protocols[n];
			break;
		}
		n++;
	}

	if (n == wsi->a.vhost->count_protocols) { /* no match */
		/* if server, that's already fatal */
		if (!lwsi_role_client(wsi)) {
			lwsl_info("%s: fail protocol %s\n", __func__, p);
			*cce = "HS: Cannot match protocol";
			goto bail2;
		}

		/* for client, find the index of our pre-bound protocol */

		n = 0;
		while (wsi->a.vhost->protocols[n].callback) {
			if (wsi->a.protocol && strcmp(wsi->a.protocol->name,
				   wsi->a.vhost->protocols[n].name) == 0) {
				wsi->a.protocol = &wsi->a.vhost->protocols[n];
				break;
			}
			n++;
		}

		if (!wsi->a.vhost->protocols[n].callback) {
			if (wsi->a.protocol)
				lwsl_err("Failed to match protocol %s\n",
						wsi->a.protocol->name);
			else
				lwsl_err("No protocol on client\n");
			*cce = "ws protocol no match";
			goto bail2;
		}
	}

	lwsl_debug("Selected protocol %s\n", wsi->a.protocol->name);

check_extensions:
	/*
	 * stitch protocol choice into the vh protocol linked list
	 * We always insert ourselves at the start of the list
	 *
	 * X <-> B
	 * X <-> pAn <-> pB
	 */

	lws_same_vh_protocol_insert(wsi, n);

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/* instantiate the accepted extensions */

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_EXTENSIONS)) {
		lwsl_ext("no client extensions allowed by server\n");
		goto check_accept;
	}

	/*
	 * break down the list of server accepted extensions
	 * and go through matching them or identifying bogons
	 */

	if (lws_hdr_copy(wsi, sb, (int)context->pt_serv_buf_size,
			 WSI_TOKEN_EXTENSIONS) < 0) {
		lwsl_warn("ext list from server failed to copy\n");
		*cce = "HS: EXT: list too big";
		goto bail2;
	}

	c = sb;
	n = 0;
	ignore = 0;
	a = NULL;
	while (more) {

		if (*c && (*c != ',' && *c != '\t')) {
			if (*c == ';') {
				ignore = 1;
				if (!a)
					a = c + 1;
			}
			if (ignore || *c == ' ') {
				c++;
				continue;
			}

			ext_name[n] = *c++;
			if (n < (int)sizeof(ext_name) - 1)
				n++;
			continue;
		}
		ext_name[n] = '\0';
		ignore = 0;
		if (!*c)
			more = 0;
		else {
			c++;
			if (!n)
				continue;
		}

		/* check we actually support it */

		lwsl_notice("checking client ext %s\n", ext_name);

		n = 0;
		ext = wsi->a.vhost->ws.extensions;
		while (ext && ext->callback) {
			if (strcmp(ext_name, ext->name)) {
				ext++;
				continue;
			}

			n = 1;
			lwsl_notice("instantiating client ext %s\n", ext_name);

			/* instantiate the extension on this conn */

			wsi->ws->active_extensions[wsi->ws->count_act_ext] = ext;

			/* allow him to construct his ext instance */

			if (ext->callback(lws_get_context(wsi), ext, wsi,
				   LWS_EXT_CB_CLIENT_CONSTRUCT,
				   (void *)&wsi->ws->act_ext_user[
				                        wsi->ws->count_act_ext],
				   (void *)&opts, 0)) {
				lwsl_info(" ext %s failed construction\n",
					  ext_name);
				ext++;
				continue;
			}

			/*
			 * allow the user code to override ext defaults if it
			 * wants to
			 */
			ext_name[0] = '\0';
			if (user_callback_handle_rxflow(wsi->a.protocol->callback,
					wsi, LWS_CALLBACK_WS_EXT_DEFAULTS,
					(char *)ext->name, ext_name,
					sizeof(ext_name))) {
				*cce = "HS: EXT: failed setting defaults";
				goto bail2;
			}

			if (ext_name[0] &&
			    lws_ext_parse_options(ext, wsi,
					          wsi->ws->act_ext_user[
						        wsi->ws->count_act_ext],
					          opts, ext_name,
						  (int)strlen(ext_name))) {
				lwsl_err("%s: unable to parse user defaults '%s'",
					 __func__, ext_name);
				*cce = "HS: EXT: failed parsing defaults";
				goto bail2;
			}

			/*
			 * give the extension the server options
			 */
			if (a && lws_ext_parse_options(ext, wsi,
					wsi->ws->act_ext_user[
					                wsi->ws->count_act_ext],
					opts, a, lws_ptr_diff(c, a))) {
				lwsl_err("%s: unable to parse remote def '%s'",
					 __func__, a);
				*cce = "HS: EXT: failed parsing options";
				goto bail2;
			}

			if (ext->callback(lws_get_context(wsi), ext, wsi,
					LWS_EXT_CB_OPTION_CONFIRM,
				      wsi->ws->act_ext_user[wsi->ws->count_act_ext],
				      NULL, 0)) {
				lwsl_err("%s: ext %s rejects server options %s",
					 __func__, ext->name, a);
				*cce = "HS: EXT: Rejects server options";
				goto bail2;
			}

			wsi->ws->count_act_ext++;

			ext++;
		}

		if (n == 0) {
			lwsl_warn("Unknown ext '%s'!\n", ext_name);
			*cce = "HS: EXT: unknown ext";
			goto bail2;
		}

		a = NULL;
		n = 0;
	}

check_accept:
#endif

	/*
	 * Confirm his accept token is the one we precomputed
	 */

	p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_ACCEPT);
	if (strcmp(p, wsi->http.ah->initial_handshake_hash_base64)) {
		lwsl_warn("lws_client_int_s_hs: accept '%s' wrong vs '%s'\n", p,
				  wsi->http.ah->initial_handshake_hash_base64);
		*cce = "HS: Accept hash wrong";
		goto bail2;
	}

	/* allocate the per-connection user memory (if any) */
	if (lws_ensure_user_space(wsi)) {
		lwsl_err("Problem allocating wsi user mem\n");
		*cce = "HS: OOM";
		goto bail2;
	}

	/*
	 * we seem to be good to go, give client last chance to check
	 * headers and OK it
	 */
	if (wsi->a.protocol->callback(wsi,
				    LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected by filter cb";
		goto bail2;
	}

	/* clear his proxy connection timeout */
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	/* free up his parsing allocations */
	lws_header_table_detach(wsi, 0);

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED, &role_ops_ws);
	lws_validity_confirmed(wsi);

	wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

	/*
	 * create the frame buffer for this connection according to the
	 * size mentioned in the protocol definition.  If 0 there, then
	 * use a big default for compatibility
	 */
	n = (int)wsi->a.protocol->rx_buffer_size;
	if (!n)
		n = (int)context->pt_serv_buf_size;
	n += LWS_PRE;
	wsi->ws->rx_ubuf = lws_malloc((unsigned int)n + 4 /* 0x0000ffff zlib */,
				"client frame buffer");
	if (!wsi->ws->rx_ubuf) {
		lwsl_err("Out of Mem allocating rx buffer %d\n", n);
		*cce = "HS: OOM";
		goto bail2;
	}
	wsi->ws->rx_ubuf_alloc = (unsigned int)n;

	lwsl_debug("handshake OK for protocol %s\n", wsi->a.protocol->name);

	/* call him back to inform him he is up */

	if (wsi->a.protocol->callback(wsi, LWS_CALLBACK_CLIENT_ESTABLISHED,
				    wsi->user_space, NULL, 0)) {
		*cce = "HS: Rejected at CLIENT_ESTABLISHED";
		goto bail3;
	}

	return 0;

bail3:
	return 3;

bail2:
	return 2;
}